

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O2

void __thiscall
brynet::net::TcpService::startWorkerThread
          (TcpService *this,size_t threadNum,FRAME_CALLBACK *callback)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer p_Var4;
  __shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __allocator_type __a2;
  long *local_110;
  pthread_mutex_t *local_108;
  pthread_mutex_t *local_100;
  shared_ptr<std::thread> local_f8;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_e8;
  undefined1 local_d8 [16];
  _Manager_type local_c8;
  _Invoker_type p_Stack_c0;
  __shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2> local_a8;
  _func_int **local_98;
  __shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> *local_90;
  __shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> *local_88;
  FRAME_CALLBACK *local_80;
  __shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr<bool> runIoLoop;
  __shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<brynet::net::EventLoop> eventLoop;
  
  local_100 = (pthread_mutex_t *)&this->mServiceGuard;
  local_80 = callback;
  std::mutex::lock((mutex *)&local_100->__data);
  local_108 = (pthread_mutex_t *)&this->mIOLoopGuard;
  std::mutex::lock((mutex *)&local_108->__data);
  if ((this->mIOLoopDatas).
      super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->mIOLoopDatas).
      super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_e8._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>
          *)CONCAT71(local_e8._M_alloc._1_7_,1);
    std::make_shared<bool,bool>((bool *)local_d8);
    local_90 = &(this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::operator=
              (local_90,(__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    std::
    vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
    ::resize(&this->mIOLoopDatas,threadNum);
    p_Var5 = &((this->mIOLoopDatas).
               super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>;
    local_88 = &((this->mIOLoopDatas).
                 super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>;
    local_98 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00154d80;
    for (; p_Var5 != local_88; p_Var5 = p_Var5 + 1) {
      local_78 = p_Var5;
      std::make_shared<brynet::net::EventLoop>();
      std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&runIoLoop.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>,local_90);
      std::__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 &eventLoop.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>);
      std::function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)>::function
                ((function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)> *)local_d8,
                 local_80);
      std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,&runIoLoop.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a8,
                 &eventLoop.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>);
      local_f8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var4 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate(&__a2,1);
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base = local_98
      ;
      (p_Var4->_M_impl)._M_storage._M_storage = (type)0x0;
      local_e8._M_alloc = &__a2;
      local_e8._M_ptr = p_Var4;
      local_110 = (long *)operator_new(0x48);
      _Var1._M_pi = local_b8._M_refcount._M_pi;
      *local_110 = (long)&PTR___State_impl_00154af8;
      local_110[1] = 0;
      local_110[2] = 0;
      local_110[3] = 0;
      local_110[4] = (long)p_Stack_c0;
      if (local_c8 != (_Manager_type)0x0) {
        local_110[1] = local_d8._0_8_;
        local_110[2] = local_d8._8_8_;
        local_110[3] = (long)local_c8;
        local_c8 = (_Manager_type)0x0;
        p_Stack_c0 = (_Invoker_type)0x0;
      }
      local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_110[5] = (long)local_b8._M_ptr;
      local_110[6] = (long)_Var1._M_pi;
      local_b8._M_ptr = (element_type *)0x0;
      uVar2 = local_a8._M_refcount._M_pi._0_4_;
      uVar3 = local_a8._M_refcount._M_pi._4_4_;
      local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(undefined4 *)(local_110 + 7) = local_a8._M_ptr._0_4_;
      *(undefined4 *)((long)local_110 + 0x3c) = local_a8._M_ptr._4_4_;
      *(undefined4 *)(local_110 + 8) = uVar2;
      *(undefined4 *)((long)local_110 + 0x44) = uVar3;
      local_a8._M_ptr = (element_type *)0x0;
      std::thread::_M_start_thread(&p_Var4->_M_impl,&local_110,0);
      if (local_110 != (long *)0x0) {
        (**(code **)(*local_110 + 8))();
      }
      local_e8._M_ptr = (pointer)0x0;
      local_f8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&p_Var4->_M_impl;
      local_f8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           &p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_e8);
      IOLoopData::Create((IOLoopData *)&stack0xffffffffffffffc0,(PTR *)&local_60,&local_f8);
      p_Var5 = local_78;
      std::__shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>::operator=
                (local_78,(__shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> *)
                          &stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      startWorkerThread(unsigned_long,std::function<void(std::shared_ptr<brynet::net::EventLoop>const&)>)
      ::$_0::~__0((__0 *)local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&runIoLoop.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&eventLoop.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  pthread_mutex_unlock(local_108);
  pthread_mutex_unlock(local_100);
  return;
}

Assistant:

void TcpService::startWorkerThread(size_t threadNum, FRAME_CALLBACK callback)
{
    std::lock_guard<std::mutex> lck(mServiceGuard);
    std::lock_guard<std::mutex> lock(mIOLoopGuard);

    if (!mIOLoopDatas.empty())
    {
        return;
    }

    mRunIOLoop = std::make_shared<bool>(true);

    mIOLoopDatas.resize(threadNum);
    for (auto& v : mIOLoopDatas)
    {
        auto eventLoop = std::make_shared<EventLoop>();
        auto runIoLoop = mRunIOLoop;
        v = IOLoopData::Create(eventLoop, std::make_shared<std::thread>([callback,
            runIoLoop,
            eventLoop]() {
            while (*runIoLoop)
            {
                auto timeout = std::chrono::milliseconds(sDefaultLoopTimeOutMS);
                if (!eventLoop->getTimerMgr()->isEmpty())
                {
                    timeout = duration_cast<milliseconds>(eventLoop->getTimerMgr()->nearLeftTime());
                }
                eventLoop->loop(timeout.count());
                if (callback != nullptr)
                {
                    callback(eventLoop);
                }
            }
        }));
    }
}